

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O2

xmlParserInputPtr xmlNewStringInputStream(xmlParserCtxtPtr ctxt,xmlChar *buffer)

{
  xmlGenericErrorFunc p_Var1;
  int size;
  int *piVar2;
  xmlGenericErrorFunc *pp_Var3;
  void **ppvVar4;
  xmlParserInputBufferPtr in;
  xmlParserInputPtr input;
  
  if (buffer == (xmlChar *)0x0) {
    input = (xmlParserInputPtr)0x0;
    xmlErrInternal(ctxt,"xmlNewStringInputStream string = NULL\n",(xmlChar *)0x0);
  }
  else {
    piVar2 = __xmlParserDebugEntities();
    if (*piVar2 != 0) {
      pp_Var3 = __xmlGenericError();
      p_Var1 = *pp_Var3;
      ppvVar4 = __xmlGenericErrorContext();
      (*p_Var1)(*ppvVar4,"new fixed input: %.30s\n",buffer);
    }
    size = xmlStrlen(buffer);
    in = xmlParserInputBufferCreateMem((char *)buffer,size,XML_CHAR_ENCODING_NONE);
    if (in == (xmlParserInputBufferPtr)0x0) {
      input = (xmlParserInputPtr)0x0;
      xmlErrMemory(ctxt,(char *)0x0);
    }
    else {
      input = xmlNewInputStream(ctxt);
      if (input == (xmlParserInputPtr)0x0) {
        xmlErrMemory(ctxt,"couldn\'t allocate a new input stream\n");
        xmlFreeParserInputBuffer(in);
        input = (xmlParserInputPtr)0x0;
      }
      else {
        input->buf = in;
        xmlBufResetInput(in->buffer,input);
      }
    }
  }
  return input;
}

Assistant:

xmlParserInputPtr
xmlNewStringInputStream(xmlParserCtxtPtr ctxt, const xmlChar *buffer) {
    xmlParserInputPtr input;
    xmlParserInputBufferPtr buf;

    if (buffer == NULL) {
        xmlErrInternal(ctxt, "xmlNewStringInputStream string = NULL\n",
	               NULL);
	return(NULL);
    }
    if (xmlParserDebugEntities)
	xmlGenericError(xmlGenericErrorContext,
		"new fixed input: %.30s\n", buffer);
    buf = xmlParserInputBufferCreateMem((const char *) buffer,
                                        xmlStrlen(buffer),
                                        XML_CHAR_ENCODING_NONE);
    if (buf == NULL) {
	xmlErrMemory(ctxt, NULL);
        return(NULL);
    }
    input = xmlNewInputStream(ctxt);
    if (input == NULL) {
        xmlErrMemory(ctxt,  "couldn't allocate a new input stream\n");
	xmlFreeParserInputBuffer(buf);
	return(NULL);
    }
    input->buf = buf;
    xmlBufResetInput(input->buf->buffer, input);
    return(input);
}